

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  Message **ppMVar4;
  ulong uVar5;
  char *description;
  Descriptor *pDVar6;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
    pDVar6 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar6,MVar7.descriptor,field,"SetAllocatedMessage");
  }
  pDVar6 = this->descriptor_;
  if (field->containing_type_ == pDVar6) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
      }
      if ((field->field_0x1 & 8) == 0) {
        pOVar3 = FieldDescriptor::real_containing_oneof(field);
        if (pOVar3 == (OneofDescriptor *)0x0) {
          if (sub_message == (Message *)0x0) {
            ClearHasBit(this,message,field);
          }
          else {
            SetHasBit(this,message,field);
          }
          ppMVar4 = MutableRaw<google::protobuf::Message*>(this,message,field);
          uVar5 = (message->super_MessageLite)._internal_metadata_.ptr_;
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          if ((uVar5 == 0) && (*ppMVar4 != (Message *)0x0)) {
            (*((*ppMVar4)->super_MessageLite)._vptr_MessageLite[1])();
          }
          *ppMVar4 = sub_message;
        }
        else {
          pOVar3 = FieldDescriptor::containing_oneof(field);
          ClearOneof(this,message,pOVar3);
          if (sub_message != (Message *)0x0) {
            ppMVar4 = MutableRaw<google::protobuf::Message*>(this,message,field);
            *ppMVar4 = sub_message;
            SetOneofCase(this,message,field);
            return;
          }
        }
        return;
      }
      uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                 field->number_,field->type_,field,&sub_message->super_MessageLite);
      return;
    }
    pDVar6 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar6,field,"SetAllocatedMessage",description);
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearHasBit(message, field);
    } else {
      SetHasBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArena() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}